

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O3

void JPCommon_push(JPCommon *jpcommon,JPCommonNode *node)

{
  _JPCommonNode *p_Var1;
  
  if (jpcommon->head == (JPCommonNode *)0x0) {
    jpcommon->head = node;
  }
  else {
    p_Var1 = jpcommon->tail;
    p_Var1->next = node;
    node->prev = p_Var1;
  }
  jpcommon->tail = node;
  return;
}

Assistant:

void JPCommon_push(JPCommon * jpcommon, JPCommonNode * node)
{
   if (jpcommon->head == NULL) {
      jpcommon->head = node;
   } else {
      jpcommon->tail->next = node;
      node->prev = jpcommon->tail;
   }
   jpcommon->tail = node;
}